

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodemap_edit.cc
# Opt level: O3

void rcg::anon_unknown_0::addNodeToList
               (vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                *list,INode *node,int level)

{
  pointer *ppNVar1;
  pointer pNVar2;
  pointer pNVar3;
  int iVar4;
  pointer pNVar5;
  pointer pNVar6;
  long *plVar7;
  ulong uVar8;
  undefined8 *puVar9;
  INode *pIVar10;
  long lVar11;
  pointer pNVar12;
  ulong uVar13;
  size_t i;
  ulong uVar14;
  FeatureList_t feature;
  value_vector local_40 [16];
  
  iVar4 = (*(code *)**(undefined8 **)(node + *(long *)(*(long *)node + -0x28)))
                    (node + *(long *)(*(long *)node + -0x28));
  if (iVar4 != 0) {
    pNVar2 = (list->
             super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pNVar2 == (list->
                  super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pNVar3 = (list->
               super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (long)pNVar2 - (long)pNVar3;
      if (lVar11 == 0x7ffffffffffffff0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar8 = lVar11 >> 4;
      uVar14 = 1;
      if (pNVar2 != pNVar3) {
        uVar14 = uVar8;
      }
      uVar13 = uVar14 + uVar8;
      if (0x7fffffffffffffe < uVar13) {
        uVar13 = 0x7ffffffffffffff;
      }
      if (CARRY8(uVar14,uVar8)) {
        uVar13 = 0x7ffffffffffffff;
      }
      pNVar5 = (pointer)operator_new(uVar13 * 0x10);
      *(int *)((long)pNVar5 + lVar11) = level;
      *(INode **)((long)pNVar5 + lVar11 + 8) = node;
      pNVar12 = pNVar5;
      for (pNVar6 = pNVar3; pNVar2 != pNVar6; pNVar6 = pNVar6 + 1) {
        iVar4 = pNVar6->value_column;
        pIVar10 = pNVar6->node;
        pNVar12->level = pNVar6->level;
        pNVar12->value_column = iVar4;
        pNVar12->node = pIVar10;
        pNVar12 = pNVar12 + 1;
      }
      if (pNVar3 != (pointer)0x0) {
        operator_delete(pNVar3);
      }
      (list->
      super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
      )._M_impl.super__Vector_impl_data._M_start = pNVar5;
      (list->
      super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
      )._M_impl.super__Vector_impl_data._M_finish = pNVar12 + 1;
      (list->
      super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pNVar5 + uVar13;
    }
    else {
      pNVar2->level = level;
      pNVar2->node = node;
      ppNVar1 = &(list->
                 super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
    }
    iVar4 = (**(code **)(*(long *)node + 0xf0))(node);
    if ((iVar4 == 8) &&
       (plVar7 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,
                                        &GenApi_3_4::ICategory::typeinfo,0xfffffffffffffffe),
       plVar7 != (long *)0x0)) {
      GenApi_3_4::value_vector::value_vector(local_40);
      (**(code **)(*plVar7 + 0x38))(plVar7,local_40);
      for (uVar14 = 0; uVar8 = GenApi_3_4::value_vector::size(), uVar14 < uVar8; uVar14 = uVar14 + 1
          ) {
        puVar9 = (undefined8 *)GenApi_3_4::value_vector::operator[]((ulong)local_40);
        pIVar10 = (INode *)(**(code **)(*(long *)*puVar9 + 0x18))();
        addNodeToList(list,pIVar10,level + 1);
      }
      GenApi_3_4::value_vector::~value_vector(local_40);
    }
  }
  return;
}

Assistant:

void addNodeToList(std::vector<NodeParam> &list, GenApi::INode *node, int level)
{
  if (node->GetAccessMode() != GenApi::NI)
  {
    list.push_back(NodeParam(level, node));

    if (node->GetPrincipalInterfaceType() == GenApi::intfICategory)
    {
      GenApi::ICategory *root=dynamic_cast<GenApi::ICategory *>(node);

      if (root != 0)
      {
        GenApi::FeatureList_t feature;
        root->GetFeatures(feature);

        level++;
        for (size_t i=0; i<feature.size(); i++)
        {
          addNodeToList(list, feature[i]->GetNode(), level);
        }
      }
    }
  }
}